

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int wherePathSolver(WhereInfo *pWInfo,LogEst nRowEst)

{
  undefined8 *puVar1;
  byte bVar2;
  char cVar3;
  undefined2 uVar4;
  undefined2 uVar5;
  Parse *pParse;
  SrcList *pSVar6;
  WhereLoop **ppWVar7;
  byte bVar8;
  i8 iVar9;
  short sVar10;
  LogEst LVar11;
  LogEst LVar12;
  ushort uVar13;
  short sVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  int extraout_EAX;
  WherePath *p;
  long lVar18;
  uint uVar19;
  ulong uVar20;
  WhereLoop ***pppWVar21;
  LogEst *pLVar22;
  short sVar23;
  uint uVar24;
  ulong uVar25;
  short sVar26;
  ulong uVar27;
  WherePath *pPath;
  WhereLoop **ppWVar28;
  ExprList *pOrderBy;
  WhereLoop *pWVar29;
  ulong uVar30;
  int iVar31;
  short sVar32;
  WhereLoop *pWVar33;
  int iVar34;
  int iVar35;
  uint uVar36;
  ulong uVar37;
  WherePath *pWVar38;
  WherePath *pWVar39;
  WherePath *pWVar40;
  long in_FS_OFFSET;
  Bitmask revMask;
  WhereLoop **local_c0;
  ulong local_a0;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pParse = pWInfo->pParse;
  bVar2 = pWInfo->nLevel;
  uVar37 = (ulong)bVar2;
  uVar36 = 1;
  if (((1 < bVar2) && (uVar36 = 5, bVar2 != 2)) && (uVar36 = 1, pParse->nErr == 0)) {
    if (((4 < bVar2) && ((pWInfo->field_0x44 & 0x10) == 0)) &&
       ((pParse->db->dbOptFlags & 0x20000000) == 0)) {
      pWInfo->field_0x44 = pWInfo->field_0x44 | 0x10;
      pSVar6 = pWInfo->pTabList;
      pWVar29 = pWInfo->pLoops;
      uVar20 = 1;
      uVar25 = 0;
      uVar27 = 0;
      do {
        if ((pSVar6->a[uVar25].fg.jointype & 0x22) == 0) {
          if (pWVar29 == (WhereLoop *)0x0) goto LAB_00192f67;
LAB_00192e9d:
          uVar30 = 0;
          iVar31 = 0;
          pWVar33 = pWVar29;
          do {
            if ((pSVar6->a[pWVar33->iTab].fg.jointype & 0x22) != 0) break;
            if (((pWVar33->prereq & uVar20) != 0) && ((pWVar33->maskSelf & (uVar30 | uVar27)) == 0))
            {
              if (pSVar6->a[pWVar33->iTab].pSTab == pSVar6->a[uVar25].pSTab) {
                uVar27 = uVar27 | uVar20;
              }
              else {
                iVar31 = iVar31 + 1;
                uVar30 = uVar30 | pWVar33->maskSelf;
              }
            }
            pWVar33 = pWVar33->pNextLoop;
          } while (pWVar33 != (WhereLoop *)0x0);
          if (3 < iVar31) {
            pWInfo->field_0x44 = pWInfo->field_0x44 | 0x20;
            uVar36 = 0x8000;
            pWVar33 = pWVar29;
            do {
              uVar24 = uVar36;
              if (uVar25 <= pWVar33->iTab) {
                if (uVar25 < pWVar33->iTab) break;
                uVar24._0_2_ = pWVar33->rRun;
                uVar24._2_2_ = pWVar33->nOut;
                if ((short)(undefined2)uVar24 <= (short)uVar36) {
                  uVar24 = uVar36;
                }
              }
              uVar36 = uVar24;
              pWVar33 = pWVar33->pNextLoop;
            } while (pWVar33 != (WhereLoop *)0x0);
            pWVar33 = pWVar29;
            sVar10 = (short)uVar36 + 1;
            if ((uVar36 & 0xffff) == 0x7fff) {
              sVar10 = (short)uVar36;
            }
            do {
              if ((((pWVar33->maskSelf & uVar30) != 0) && (pWVar33->nLTerm == 0)) &&
                 (pWVar33->rRun < sVar10)) {
                pWVar33->rRun = sVar10;
              }
              ppWVar7 = &pWVar33->pNextLoop;
              pWVar33 = *ppWVar7;
            } while (*ppWVar7 != (WhereLoop *)0x0);
          }
        }
        else {
          if (uVar37 < uVar25 + 4) break;
          for (; pWVar29 != (WhereLoop *)0x0; pWVar29 = pWVar29->pNextLoop) {
            if ((byte)uVar25 < pWVar29->iTab) goto LAB_00192e9d;
          }
LAB_00192f67:
          pWVar29 = (WhereLoop *)0x0;
        }
        uVar25 = uVar25 + 1;
        uVar20 = uVar20 * 2;
      } while (uVar25 != uVar37);
    }
    uVar36 = 0x12;
    if ((pWInfo->field_0x44 & 0x20) == 0) {
      uVar36 = 0xc;
    }
  }
  iVar31 = 0;
  if (nRowEst != 0 && pWInfo->pOrderBy != (ExprList *)0x0) {
    iVar31 = pWInfo->pOrderBy->nExpr;
  }
  p = (WherePath *)
      sqlite3DbMallocRawNN
                (pParse->db,
                 (long)(int)(((uint)bVar2 * 0x10 + 0x40) * uVar36 + (int)((long)iVar31 * 2)));
  if (p == (WherePath *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return (int)*(long *)(in_FS_OFFSET + 0x28);
    }
    goto LAB_001938be;
  }
  uVar20 = (ulong)(uVar36 << 5);
  pPath = (WherePath *)((long)&p->maskLoop + uVar20);
  puVar1 = (undefined8 *)((long)&p->nRow + uVar20);
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1 = (undefined8 *)((long)&p->maskLoop + uVar20);
  *puVar1 = 0;
  puVar1[1] = 0;
  local_c0 = (WhereLoop **)((long)&pPath->maskLoop + uVar20);
  pppWVar21 = &p->aLoop;
  uVar24 = uVar36 * 2 + 1;
  do {
    *pppWVar21 = local_c0;
    local_c0 = (WhereLoop **)((long)local_c0 + (ulong)((uint)bVar2 * 8));
    pppWVar21 = pppWVar21 + 4;
    uVar24 = uVar24 - 1;
  } while (1 < uVar24);
  if (iVar31 == 0) {
    uVar5 = pParse->nQueryLoop;
    sVar10 = 0x30;
    if ((short)uVar5 < 0x30) {
      sVar10 = uVar5;
    }
    local_c0 = (WhereLoop **)0x0;
  }
  else {
    memset(local_c0,0,(long)iVar31 * 2);
    uVar4 = pParse->nQueryLoop;
    sVar10 = 0x30;
    if ((short)uVar4 < 0x30) {
      sVar10 = uVar4;
    }
    pPath->isOrdered = -(uVar37 != 0) | (byte)iVar31;
  }
  pPath->nRow = sVar10;
  if (uVar37 == 0) {
LAB_00193699:
    if ((((pWInfo->wctrlFlags & 0x180) == 0x100) && (nRowEst != 0)) && (pWInfo->eDistinct == '\0'))
    {
      local_40 = &DAT_aaaaaaaaaaaaaaaa;
      iVar9 = wherePathSatisfiesOrderBy
                        (pWInfo,pWInfo->pResultSet,pPath,0x80,bVar2 - 1,pPath->aLoop[uVar37 - 1],
                         (Bitmask *)&local_40);
      if (pWInfo->pResultSet->nExpr == (int)iVar9) {
        pWInfo->eDistinct = '\x02';
      }
    }
    bVar8 = pWInfo->field_0x44;
    pWInfo->field_0x44 = bVar8 & 0xfb;
    pOrderBy = pWInfo->pOrderBy;
    if (pOrderBy != (ExprList *)0x0) {
      cVar3 = pPath->isOrdered;
      pWInfo->nOBSat = cVar3;
      uVar13 = pWInfo->wctrlFlags;
      uVar36 = (uint)uVar13;
      if ((char)uVar13 < '\0') {
        if (pOrderBy->nExpr == (int)cVar3) {
          pWInfo->eDistinct = '\x02';
        }
      }
      else {
        pWInfo->revMask = pPath->revLoop;
        if (cVar3 < '\x01') {
          pWInfo->nOBSat = '\0';
          if (bVar2 != 0) {
            uVar19 = bVar2 - 1;
            uVar24 = pPath->aLoop[uVar19]->wsFlags;
            if ((~uVar24 & 0x104) != 0 && (uVar24 >> 0xc & 1) == 0) {
              local_40 = (undefined1 *)0x0;
              iVar9 = wherePathSatisfiesOrderBy
                                (pWInfo,pOrderBy,pPath,0x800,(u16)uVar19,pPath->aLoop[uVar19],
                                 (Bitmask *)&local_40);
              pOrderBy = pWInfo->pOrderBy;
              if (pOrderBy->nExpr == (int)iVar9) {
                pWInfo->field_0x44 = pWInfo->field_0x44 | 4;
                pWInfo->revMask = (Bitmask)local_40;
              }
              uVar36 = (uint)pWInfo->wctrlFlags;
            }
          }
        }
        else if (((uVar13 & 3) != 0 && bVar2 != 0) && cVar3 == '\x01') {
          pWInfo->field_0x44 = bVar8 | 4;
        }
      }
      if ((((uVar36 >> 9 & 1) != 0) && (uVar37 != 0)) && (pOrderBy->nExpr == (int)pWInfo->nOBSat)) {
        local_40 = (undefined1 *)0x0;
        uVar36 = bVar2 - 1;
        iVar9 = wherePathSatisfiesOrderBy
                          (pWInfo,pOrderBy,pPath,0,(u16)uVar36,pPath->aLoop[uVar36],
                           (Bitmask *)&local_40);
        if (pWInfo->pOrderBy->nExpr == (int)iVar9) {
          pWInfo->field_0x44 = pWInfo->field_0x44 | 8;
          pWInfo->revMask = (Bitmask)local_40;
        }
      }
    }
    pWInfo->nRowOut = pPath->nRow;
  }
  else {
    local_a0 = 0;
    iVar34 = 1;
    sVar10 = 0;
    sVar32 = 0;
    uVar24 = 0;
    pWVar38 = p;
    pWVar40 = pPath;
    do {
      pPath = pWVar38;
      if (iVar34 < 1) {
        uVar20 = 0;
      }
      else {
        uVar20 = 0;
        iVar15 = 0;
        pWVar38 = pWVar40;
        do {
          for (pWVar29 = pWInfo->pLoops; pWVar29 != (WhereLoop *)0x0; pWVar29 = pWVar29->pNextLoop)
          {
            local_40 = &DAT_aaaaaaaaaaaaaaaa;
            uVar25 = pWVar38->maskLoop;
            if ((((pWVar29->prereq & ~uVar25) == 0) &&
                (uVar27 = pWVar29->maskSelf, (uVar27 & uVar25) == 0)) &&
               ((sVar26 = pWVar38->nRow, (pWVar29->wsFlags & 0x4000) == 0 || (2 < sVar26)))) {
              uVar19 = (uint)uVar20;
              LVar11 = pWVar29->rRun + sVar26;
              if (pWVar29->rSetup != 0) {
                LVar11 = sqlite3LogEstAdd(pWVar29->rSetup,LVar11);
              }
              LVar11 = sqlite3LogEstAdd(LVar11,pWVar38->rUnsort);
              sVar26 = sVar26 + pWVar29->nOut;
              bVar8 = pWVar38->isOrdered;
              if ((char)bVar8 < '\0') {
                local_40 = (undefined1 *)0x0;
                bVar8 = wherePathSatisfiesOrderBy
                                  (pWInfo,pWInfo->pOrderBy,pWVar38,pWInfo->wctrlFlags,(u16)local_a0,
                                   pWVar29,(Bitmask *)&local_40);
              }
              else {
                local_40 = (undefined1 *)pWVar38->revLoop;
              }
              iVar35 = iVar31 - (char)bVar8;
              if ((iVar35 == 0 || iVar31 < (char)bVar8) || (char)bVar8 < '\0') {
                LVar12 = LVar11 + -2;
                sVar14 = LVar11;
              }
              else {
                sVar14 = *(short *)((long)local_c0 + (ulong)bVar8 * 2);
                if (sVar14 == 0) {
                  iVar16 = pWInfo->pSelect->pEList->nExpr;
                  iVar16 = iVar16 + (int)((ulong)((long)(iVar16 + 0x3b) * -0x77777777) >> 0x20) +
                           0x3b;
                  LVar12 = sqlite3LogEst((long)((iVar16 >> 4) - (iVar16 >> 0x1f)));
                  sVar23 = LVar12 + nRowEst;
                  if (bVar8 != 0) {
                    LVar12 = sqlite3LogEst((long)((iVar35 * 100) / iVar31));
                    sVar23 = sVar23 + LVar12 + -0x42;
                  }
                  if ((pWInfo->wctrlFlags >> 0xe & 1) == 0) {
                    uVar13 = nRowEst;
                    if ((pWInfo->wctrlFlags & 0x100) != 0) {
                      uVar13 = nRowEst - 10;
                    }
                    if (nRowEst < 0xb) {
                      uVar13 = nRowEst;
                    }
                  }
                  else {
                    sVar14 = 10;
                    if (bVar8 != 0) {
                      sVar14 = 0x10;
                    }
                    sVar23 = sVar23 + sVar14;
                    uVar13 = pWInfo->iLimit;
                    if (nRowEst <= pWInfo->iLimit) {
                      uVar13 = nRowEst;
                    }
                  }
                  if ((short)uVar13 < 0xb) {
                    sVar14 = 0;
                  }
                  else {
                    LVar12 = sqlite3LogEst((ulong)uVar13);
                    sVar14 = LVar12 + -0x21;
                  }
                  sVar14 = sVar14 + sVar23;
                  *(short *)((long)local_c0 + (ulong)bVar8 * 2) = sVar14;
                }
                LVar12 = sqlite3LogEstAdd(LVar11,sVar14);
                sVar14 = LVar12 + 3;
                LVar12 = LVar11;
              }
              if (0 < (int)uVar19) {
                uVar30 = uVar20;
                pWVar39 = pPath;
                do {
                  if ((pWVar39->maskLoop == (uVar27 | uVar25)) &&
                     (-1 < (char)(pWVar39->isOrdered ^ bVar8))) {
                    if ((pWVar39->rCost < sVar14) ||
                       ((pWVar39->rCost == sVar14 &&
                        ((pWVar39->nRow < sVar26 ||
                         ((pWVar39->nRow == sVar26 &&
                          ((pWVar39->rUnsort < LVar12 ||
                           ((pWVar39->rUnsort == LVar12 &&
                            (iVar35 = whereLoopIsNoBetter(pWVar29,pWVar39->aLoop[local_a0]),
                            iVar35 != 0)))))))))))) goto LAB_001934fc;
                    goto LAB_001933ea;
                  }
                  pWVar39 = pWVar39 + 1;
                  uVar17 = (int)uVar30 - 1;
                  uVar30 = (ulong)uVar17;
                } while (uVar17 != 0);
              }
              uVar17 = uVar19;
              if (((int)uVar19 < (int)uVar36) ||
                 ((sVar14 <= sVar32 && ((uVar17 = uVar24, sVar14 != sVar32 || (LVar12 < sVar10))))))
              {
                uVar19 = uVar19 + ((int)uVar19 < (int)uVar36);
                pWVar39 = pPath + (int)uVar17;
LAB_001933ea:
                pWVar39->maskLoop = pWVar29->maskSelf | pWVar38->maskLoop;
                pWVar39->revLoop = (Bitmask)local_40;
                pWVar39->nRow = sVar26;
                pWVar39->rCost = sVar14;
                pWVar39->rUnsort = LVar12;
                pWVar39->isOrdered = bVar8;
                memcpy(pWVar39->aLoop,pWVar38->aLoop,local_a0 * 8);
                pWVar39->aLoop[local_a0] = pWVar29;
                uVar20 = (ulong)uVar19;
                if ((int)uVar36 <= (int)uVar19) {
                  uVar24 = 0;
                  sVar10 = pPath->nRow;
                  sVar32 = pPath->rCost;
                  if (1 < uVar36) {
                    uVar19 = 1;
                    uVar24 = 0;
                    pLVar22 = &pPath[1].rUnsort;
                    do {
                      sVar26 = pLVar22[-1];
                      if (sVar32 < sVar26) {
                        uVar24 = uVar19;
                        sVar10 = *pLVar22;
                        sVar32 = sVar26;
                      }
                      else if ((sVar26 == sVar32) && (sVar10 < *pLVar22)) {
                        uVar24 = uVar19;
                        sVar10 = *pLVar22;
                        sVar32 = sVar26;
                      }
                      uVar19 = uVar19 + 1;
                      pLVar22 = pLVar22 + 0x10;
                    } while (uVar36 != uVar19);
                  }
                }
              }
            }
LAB_001934fc:
          }
          iVar15 = iVar15 + 1;
          pWVar38 = pWVar38 + 1;
        } while (iVar15 != iVar34);
      }
      local_a0 = local_a0 + 1;
      iVar34 = (int)uVar20;
      pWVar38 = pWVar40;
      pWVar40 = pPath;
    } while (local_a0 != uVar37);
    if (iVar34 != 0) {
      if (1 < iVar34) {
        lVar18 = uVar20 - 1;
        pWVar38 = pPath;
        do {
          pWVar40 = pWVar38 + 1;
          if (pPath->rCost <= pWVar38[1].rCost) {
            pWVar40 = pPath;
          }
          pPath = pWVar40;
          lVar18 = lVar18 + -1;
          pWVar38 = pWVar38 + 1;
        } while (lVar18 != 0);
      }
      if (bVar2 != 0) {
        ppWVar7 = pPath->aLoop;
        pSVar6 = pWInfo->pTabList;
        ppWVar28 = &pWInfo->a[0].pWLoop;
        uVar20 = 0;
        do {
          pWVar29 = ppWVar7[uVar20];
          *ppWVar28 = pWVar29;
          bVar8 = pWVar29->iTab;
          *(byte *)(ppWVar28 + -4) = bVar8;
          *(int *)((long)ppWVar28 + -0x5c) = pSVar6->a[bVar8].iCursor;
          uVar20 = uVar20 + 1;
          ppWVar28 = ppWVar28 + 0xe;
        } while (uVar37 != uVar20);
      }
      goto LAB_00193699;
    }
    sqlite3ErrorMsg(pParse,"no query solution");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    sqlite3DbFreeNN(pParse->db,p);
    return extraout_EAX;
  }
LAB_001938be:
  __stack_chk_fail();
}

Assistant:

static int wherePathSolver(WhereInfo *pWInfo, LogEst nRowEst){
  int mxChoice;             /* Maximum number of simultaneous paths tracked */
  int nLoop;                /* Number of terms in the join */
  Parse *pParse;            /* Parsing context */
  int iLoop;                /* Loop counter over the terms of the join */
  int ii, jj;               /* Loop counters */
  int mxI = 0;              /* Index of next entry to replace */
  int nOrderBy;             /* Number of ORDER BY clause terms */
  LogEst mxCost = 0;        /* Maximum cost of a set of paths */
  LogEst mxUnsort = 0;      /* Maximum unsorted cost of a set of path */
  int nTo, nFrom;           /* Number of valid entries in aTo[] and aFrom[] */
  WherePath *aFrom;         /* All nFrom paths at the previous level */
  WherePath *aTo;           /* The nTo best paths at the current level */
  WherePath *pFrom;         /* An element of aFrom[] that we are working on */
  WherePath *pTo;           /* An element of aTo[] that we are working on */
  WhereLoop *pWLoop;        /* One of the WhereLoop objects */
  WhereLoop **pX;           /* Used to divy up the pSpace memory */
  LogEst *aSortCost = 0;    /* Sorting and partial sorting costs */
  char *pSpace;             /* Temporary memory used by this routine */
  int nSpace;               /* Bytes of space allocated at pSpace */

  pParse = pWInfo->pParse;
  nLoop = pWInfo->nLevel;
  WHERETRACE(0x002, ("---- begin solver.  (nRowEst=%d, nQueryLoop=%d)\n",
                     nRowEst, pParse->nQueryLoop));
  /* TUNING: mxChoice is the maximum number of possible paths to preserve
  ** at each step.  Based on the number of loops in the FROM clause:
  **
  **     nLoop      mxChoice
  **     -----      --------
  **       1            1            // the most common case
  **       2            5
  **       3+        12 or 18        // see computeMxChoice()
  */
  if( nLoop<=1 ){
    mxChoice = 1;
  }else if( nLoop==2 ){
    mxChoice = 5;
  }else if( pParse->nErr ){
    mxChoice = 1;
  }else{
    mxChoice = computeMxChoice(pWInfo);
  }
  assert( nLoop<=pWInfo->pTabList->nSrc );

  /* If nRowEst is zero and there is an ORDER BY clause, ignore it. In this
  ** case the purpose of this call is to estimate the number of rows returned
  ** by the overall query. Once this estimate has been obtained, the caller
  ** will invoke this function a second time, passing the estimate as the
  ** nRowEst parameter.  */
  if( pWInfo->pOrderBy==0 || nRowEst==0 ){
    nOrderBy = 0;
  }else{
    nOrderBy = pWInfo->pOrderBy->nExpr;
  }

  /* Allocate and initialize space for aTo, aFrom and aSortCost[] */
  nSpace = (sizeof(WherePath)+sizeof(WhereLoop*)*nLoop)*mxChoice*2;
  nSpace += sizeof(LogEst) * nOrderBy;
  pSpace = sqlite3StackAllocRawNN(pParse->db, nSpace);
  if( pSpace==0 ) return SQLITE_NOMEM_BKPT;
  aTo = (WherePath*)pSpace;
  aFrom = aTo+mxChoice;
  memset(aFrom, 0, sizeof(aFrom[0]));
  pX = (WhereLoop**)(aFrom+mxChoice);
  for(ii=mxChoice*2, pFrom=aTo; ii>0; ii--, pFrom++, pX += nLoop){
    pFrom->aLoop = pX;
  }
  if( nOrderBy ){
    /* If there is an ORDER BY clause and it is not being ignored, set up
    ** space for the aSortCost[] array. Each element of the aSortCost array
    ** is either zero - meaning it has not yet been initialized - or the
    ** cost of sorting nRowEst rows of data where the first X terms of
    ** the ORDER BY clause are already in order, where X is the array
    ** index.  */
    aSortCost = (LogEst*)pX;
    memset(aSortCost, 0, sizeof(LogEst) * nOrderBy);
  }
  assert( aSortCost==0 || &pSpace[nSpace]==(char*)&aSortCost[nOrderBy] );
  assert( aSortCost!=0 || &pSpace[nSpace]==(char*)pX );

  /* Seed the search with a single WherePath containing zero WhereLoops.
  **
  ** TUNING: Do not let the number of iterations go above 28.  If the cost
  ** of computing an automatic index is not paid back within the first 28
  ** rows, then do not use the automatic index. */
  aFrom[0].nRow = MIN(pParse->nQueryLoop, 48);  assert( 48==sqlite3LogEst(28) );
  nFrom = 1;
  assert( aFrom[0].isOrdered==0 );
  if( nOrderBy ){
    /* If nLoop is zero, then there are no FROM terms in the query. Since
    ** in this case the query may return a maximum of one row, the results
    ** are already in the requested order. Set isOrdered to nOrderBy to
    ** indicate this. Or, if nLoop is greater than zero, set isOrdered to
    ** -1, indicating that the result set may or may not be ordered,
    ** depending on the loops added to the current plan.  */
    aFrom[0].isOrdered = nLoop>0 ? -1 : nOrderBy;
  }

  /* Compute successively longer WherePaths using the previous generation
  ** of WherePaths as the basis for the next.  Keep track of the mxChoice
  ** best paths at each generation */
  for(iLoop=0; iLoop<nLoop; iLoop++){
    nTo = 0;
    for(ii=0, pFrom=aFrom; ii<nFrom; ii++, pFrom++){
      for(pWLoop=pWInfo->pLoops; pWLoop; pWLoop=pWLoop->pNextLoop){
        LogEst nOut;                      /* Rows visited by (pFrom+pWLoop) */
        LogEst rCost;                     /* Cost of path (pFrom+pWLoop) */
        LogEst rUnsort;                   /* Unsorted cost of (pFrom+pWLoop) */
        i8 isOrdered;                     /* isOrdered for (pFrom+pWLoop) */
        Bitmask maskNew;                  /* Mask of src visited by (..) */
        Bitmask revMask;                  /* Mask of rev-order loops for (..) */

        if( (pWLoop->prereq & ~pFrom->maskLoop)!=0 ) continue;
        if( (pWLoop->maskSelf & pFrom->maskLoop)!=0 ) continue;
        if( (pWLoop->wsFlags & WHERE_AUTO_INDEX)!=0 && pFrom->nRow<3 ){
          /* Do not use an automatic index if the this loop is expected
          ** to run less than 1.25 times.  It is tempting to also exclude
          ** automatic index usage on an outer loop, but sometimes an automatic
          ** index is useful in the outer loop of a correlated subquery. */
          assert( 10==sqlite3LogEst(2) );
          continue;
        }

        /* At this point, pWLoop is a candidate to be the next loop.
        ** Compute its cost */
        rUnsort = pWLoop->rRun + pFrom->nRow;
        if( pWLoop->rSetup ){
          rUnsort = sqlite3LogEstAdd(pWLoop->rSetup, rUnsort);
        }
        rUnsort = sqlite3LogEstAdd(rUnsort, pFrom->rUnsort);
        nOut = pFrom->nRow + pWLoop->nOut;
        maskNew = pFrom->maskLoop | pWLoop->maskSelf;
        isOrdered = pFrom->isOrdered;
        if( isOrdered<0 ){
          revMask = 0;
          isOrdered = wherePathSatisfiesOrderBy(pWInfo,
                       pWInfo->pOrderBy, pFrom, pWInfo->wctrlFlags,
                       iLoop, pWLoop, &revMask);
        }else{
          revMask = pFrom->revLoop;
        }
        if( isOrdered>=0 && isOrdered<nOrderBy ){
          if( aSortCost[isOrdered]==0 ){
            aSortCost[isOrdered] = whereSortingCost(
                pWInfo, nRowEst, nOrderBy, isOrdered
            );
          }
          /* TUNING:  Add a small extra penalty (3) to sorting as an
          ** extra encouragement to the query planner to select a plan
          ** where the rows emerge in the correct order without any sorting
          ** required. */
          rCost = sqlite3LogEstAdd(rUnsort, aSortCost[isOrdered]) + 3;

          WHERETRACE(0x002,
              ("---- sort cost=%-3d (%d/%d) increases cost %3d to %-3d\n",
               aSortCost[isOrdered], (nOrderBy-isOrdered), nOrderBy,
               rUnsort, rCost));
        }else{
          rCost = rUnsort;
          rUnsort -= 2;  /* TUNING:  Slight bias in favor of no-sort plans */
        }

        /* Check to see if pWLoop should be added to the set of
        ** mxChoice best-so-far paths.
        **
        ** First look for an existing path among best-so-far paths
        ** that covers the same set of loops and has the same isOrdered
        ** setting as the current path candidate.
        **
        ** The term "((pTo->isOrdered^isOrdered)&0x80)==0" is equivalent
        ** to (pTo->isOrdered==(-1))==(isOrdered==(-1))" for the range
        ** of legal values for isOrdered, -1..64.
        */
        testcase( nTo==0 );
        for(jj=0, pTo=aTo; jj<nTo; jj++, pTo++){
          if( pTo->maskLoop==maskNew
           && ((pTo->isOrdered^isOrdered)&0x80)==0
          ){
            testcase( jj==nTo-1 );
            break;
          }
        }
        if( jj>=nTo ){
          /* None of the existing best-so-far paths match the candidate. */
          if( nTo>=mxChoice
           && (rCost>mxCost || (rCost==mxCost && rUnsort>=mxUnsort))
          ){
            /* The current candidate is no better than any of the mxChoice
            ** paths currently in the best-so-far buffer.  So discard
            ** this candidate as not viable. */
#ifdef WHERETRACE_ENABLED /* 0x4 */
            if( sqlite3WhereTrace&0x4 ){
              sqlite3DebugPrintf("Skip   %s cost=%-3d,%3d,%3d order=%c\n",
                  wherePathName(pFrom, iLoop, pWLoop), rCost, nOut, rUnsort,
                  isOrdered>=0 ? isOrdered+'0' : '?');
            }
#endif
            continue;
          }
          /* If we reach this points it means that the new candidate path
          ** needs to be added to the set of best-so-far paths. */
          if( nTo<mxChoice ){
            /* Increase the size of the aTo set by one */
            jj = nTo++;
          }else{
            /* New path replaces the prior worst to keep count below mxChoice */
            jj = mxI;
          }
          pTo = &aTo[jj];
#ifdef WHERETRACE_ENABLED /* 0x4 */
          if( sqlite3WhereTrace&0x4 ){
            sqlite3DebugPrintf("New    %s cost=%-3d,%3d,%3d order=%c\n",
                wherePathName(pFrom, iLoop, pWLoop), rCost, nOut, rUnsort,
                isOrdered>=0 ? isOrdered+'0' : '?');
          }
#endif
        }else{
          /* Control reaches here if best-so-far path pTo=aTo[jj] covers the
          ** same set of loops and has the same isOrdered setting as the
          ** candidate path.  Check to see if the candidate should replace
          ** pTo or if the candidate should be skipped.
          **
          ** The conditional is an expanded vector comparison equivalent to:
          **   (pTo->rCost,pTo->nRow,pTo->rUnsort) <= (rCost,nOut,rUnsort)
          */
          if( (pTo->rCost<rCost)
           || (pTo->rCost==rCost && pTo->nRow<nOut)
           || (pTo->rCost==rCost && pTo->nRow==nOut && pTo->rUnsort<rUnsort)
           || (pTo->rCost==rCost && pTo->nRow==nOut && pTo->rUnsort==rUnsort
                  && whereLoopIsNoBetter(pWLoop, pTo->aLoop[iLoop]) )
          ){
#ifdef WHERETRACE_ENABLED /* 0x4 */
            if( sqlite3WhereTrace&0x4 ){
              sqlite3DebugPrintf(
                  "Skip   %s cost=%-3d,%3d,%3d order=%c",
                  wherePathName(pFrom, iLoop, pWLoop), rCost, nOut, rUnsort,
                  isOrdered>=0 ? isOrdered+'0' : '?');
              sqlite3DebugPrintf("   vs %s cost=%-3d,%3d,%3d order=%c\n",
                  wherePathName(pTo, iLoop+1, 0), pTo->rCost, pTo->nRow,
                  pTo->rUnsort, pTo->isOrdered>=0 ? pTo->isOrdered+'0' : '?');
            }
#endif
            /* Discard the candidate path from further consideration */
            testcase( pTo->rCost==rCost );
            continue;
          }
          testcase( pTo->rCost==rCost+1 );
          /* Control reaches here if the candidate path is better than the
          ** pTo path.  Replace pTo with the candidate. */
#ifdef WHERETRACE_ENABLED /* 0x4 */
          if( sqlite3WhereTrace&0x4 ){
            sqlite3DebugPrintf(
                "Update %s cost=%-3d,%3d,%3d order=%c",
                wherePathName(pFrom, iLoop, pWLoop), rCost, nOut, rUnsort,
                isOrdered>=0 ? isOrdered+'0' : '?');
            sqlite3DebugPrintf("  was %s cost=%-3d,%3d,%3d order=%c\n",
                wherePathName(pTo, iLoop+1, 0), pTo->rCost, pTo->nRow,
                pTo->rUnsort, pTo->isOrdered>=0 ? pTo->isOrdered+'0' : '?');
          }
#endif
        }
        /* pWLoop is a winner.  Add it to the set of best so far */
        pTo->maskLoop = pFrom->maskLoop | pWLoop->maskSelf;
        pTo->revLoop = revMask;
        pTo->nRow = nOut;
        pTo->rCost = rCost;
        pTo->rUnsort = rUnsort;
        pTo->isOrdered = isOrdered;
        memcpy(pTo->aLoop, pFrom->aLoop, sizeof(WhereLoop*)*iLoop);
        pTo->aLoop[iLoop] = pWLoop;
        if( nTo>=mxChoice ){
          mxI = 0;
          mxCost = aTo[0].rCost;
          mxUnsort = aTo[0].nRow;
          for(jj=1, pTo=&aTo[1]; jj<mxChoice; jj++, pTo++){
            if( pTo->rCost>mxCost
             || (pTo->rCost==mxCost && pTo->rUnsort>mxUnsort)
            ){
              mxCost = pTo->rCost;
              mxUnsort = pTo->rUnsort;
              mxI = jj;
            }
          }
        }
      }
    }

#ifdef WHERETRACE_ENABLED  /* >=2 */
    if( sqlite3WhereTrace & 0x02 ){
      LogEst rMin, rFloor = 0;
      int nDone = 0;
      int nProgress;
      sqlite3DebugPrintf("---- after round %d ----\n", iLoop);
      do{
        nProgress = 0;
        rMin = 0x7fff;
        for(ii=0, pTo=aTo; ii<nTo; ii++, pTo++){
          if( pTo->rCost>rFloor && pTo->rCost<rMin ) rMin = pTo->rCost;
        }
        for(ii=0, pTo=aTo; ii<nTo; ii++, pTo++){
          if( pTo->rCost==rMin ){
            sqlite3DebugPrintf(" %s cost=%-3d nrow=%-3d order=%c",
               wherePathName(pTo, iLoop+1, 0), pTo->rCost, pTo->nRow,
               pTo->isOrdered>=0 ? (pTo->isOrdered+'0') : '?');
            if( pTo->isOrdered>0 ){
              sqlite3DebugPrintf(" rev=0x%llx\n", pTo->revLoop);
            }else{
              sqlite3DebugPrintf("\n");
            }
            nDone++;
            nProgress++;
          }
        }
        rFloor = rMin;
      }while( nDone<nTo && nProgress>0 );
    }
#endif

    /* Swap the roles of aFrom and aTo for the next generation */
    pFrom = aTo;
    aTo = aFrom;
    aFrom = pFrom;
    nFrom = nTo;
  }

  if( nFrom==0 ){
    sqlite3ErrorMsg(pParse, "no query solution");
    sqlite3StackFreeNN(pParse->db, pSpace);
    return SQLITE_ERROR;
  }

  /* Find the lowest cost path.  pFrom will be left pointing to that path */
  pFrom = aFrom;
  for(ii=1; ii<nFrom; ii++){
    if( pFrom->rCost>aFrom[ii].rCost ) pFrom = &aFrom[ii];
  }
  assert( pWInfo->nLevel==nLoop );
  /* Load the lowest cost path into pWInfo */
  for(iLoop=0; iLoop<nLoop; iLoop++){
    WhereLevel *pLevel = pWInfo->a + iLoop;
    pLevel->pWLoop = pWLoop = pFrom->aLoop[iLoop];
    pLevel->iFrom = pWLoop->iTab;
    pLevel->iTabCur = pWInfo->pTabList->a[pLevel->iFrom].iCursor;
  }
  if( (pWInfo->wctrlFlags & WHERE_WANT_DISTINCT)!=0
   && (pWInfo->wctrlFlags & WHERE_DISTINCTBY)==0
   && pWInfo->eDistinct==WHERE_DISTINCT_NOOP
   && nRowEst
  ){
    Bitmask notUsed;
    int rc = wherePathSatisfiesOrderBy(pWInfo, pWInfo->pResultSet, pFrom,
                 WHERE_DISTINCTBY, nLoop-1, pFrom->aLoop[nLoop-1], &notUsed);
    if( rc==pWInfo->pResultSet->nExpr ){
      pWInfo->eDistinct = WHERE_DISTINCT_ORDERED;
    }
  }
  pWInfo->bOrderedInnerLoop = 0;
  if( pWInfo->pOrderBy ){
    pWInfo->nOBSat = pFrom->isOrdered;
    if( pWInfo->wctrlFlags & WHERE_DISTINCTBY ){
      if( pFrom->isOrdered==pWInfo->pOrderBy->nExpr ){
        pWInfo->eDistinct = WHERE_DISTINCT_ORDERED;
      }
      /* vvv--- See check-in [12ad822d9b827777] on 2023-03-16 ---vvv */
      assert( pWInfo->pSelect->pOrderBy==0
           || pWInfo->nOBSat <= pWInfo->pSelect->pOrderBy->nExpr );
    }else{
      pWInfo->revMask = pFrom->revLoop;
      if( pWInfo->nOBSat<=0 ){
        pWInfo->nOBSat = 0;
        if( nLoop>0 ){
          u32 wsFlags = pFrom->aLoop[nLoop-1]->wsFlags;
          if( (wsFlags & WHERE_ONEROW)==0
           && (wsFlags&(WHERE_IPK|WHERE_COLUMN_IN))!=(WHERE_IPK|WHERE_COLUMN_IN)
          ){
            Bitmask m = 0;
            int rc = wherePathSatisfiesOrderBy(pWInfo, pWInfo->pOrderBy, pFrom,
                      WHERE_ORDERBY_LIMIT, nLoop-1, pFrom->aLoop[nLoop-1], &m);
            testcase( wsFlags & WHERE_IPK );
            testcase( wsFlags & WHERE_COLUMN_IN );
            if( rc==pWInfo->pOrderBy->nExpr ){
              pWInfo->bOrderedInnerLoop = 1;
              pWInfo->revMask = m;
            }
          }
        }
      }else if( nLoop
            && pWInfo->nOBSat==1
            && (pWInfo->wctrlFlags & (WHERE_ORDERBY_MIN|WHERE_ORDERBY_MAX))!=0
            ){
        pWInfo->bOrderedInnerLoop = 1;
      }
    }
    if( (pWInfo->wctrlFlags & WHERE_SORTBYGROUP)
        && pWInfo->nOBSat==pWInfo->pOrderBy->nExpr && nLoop>0
    ){
      Bitmask revMask = 0;
      int nOrder = wherePathSatisfiesOrderBy(pWInfo, pWInfo->pOrderBy,
          pFrom, 0, nLoop-1, pFrom->aLoop[nLoop-1], &revMask
      );
      assert( pWInfo->sorted==0 );
      if( nOrder==pWInfo->pOrderBy->nExpr ){
        pWInfo->sorted = 1;
        pWInfo->revMask = revMask;
      }
    }
  }

  pWInfo->nRowOut = pFrom->nRow;
#ifdef WHERETRACE_ENABLED
  pWInfo->rTotalCost = pFrom->rCost;
#endif

  /* Free temporary memory and return success */
  sqlite3StackFreeNN(pParse->db, pSpace);
  return SQLITE_OK;
}